

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

bool __thiscall
QGenericItemModel::setItemData(QGenericItemModel *this,QModelIndex *index,QMap<int,_QVariant> *data)

{
  bool bVar1;
  QGenericItemModelImplBase *in_stack_00000018;
  
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84fa54);
  bVar1 = QGenericItemModelImplBase::call<bool,QModelIndex,QMap<int,QVariant>>
                    (in_stack_00000018,this._4_4_,index,data);
  return bVar1;
}

Assistant:

bool QGenericItemModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &data)
{
    return impl->call<bool>(QGenericItemModelImplBase::SetItemData, index, data);
}